

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  IfcConstructionResource *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcConstructionResource + -0x18);
  this_00 = (IfcConstructionResource *)(&(this->super_IfcConstructionResource).field_0x0 + lVar2);
  plVar1 = (long *)((this->JobDescription).ptr.field_2._M_local_buf + lVar2);
  plVar1[-0x36] = 0x90b1a0;
  plVar1[3] = 0x90b290;
  plVar1[-0x25] = 0x90b1c8;
  plVar1[-0x23] = 0x90b1f0;
  plVar1[-0x1c] = 0x90b218;
  plVar1[-0x1a] = 0x90b240;
  plVar1[-7] = 0x90b268;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_00 + 1) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_00 + 1));
  }
  IfcConstructionResource::~IfcConstructionResource(this_00,&PTR_construction_vtable_24__0090b2a8);
  operator_delete(this_00,0x1e0);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}